

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::
set_option<asio::detail::socket_option::boolean<1,2>>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          boolean<1,_2> *option,error_code *ec)

{
  error_code eVar1;
  
  socket_ops::setsockopt
            ((impl->super_base_implementation_type).socket_,(int)impl + 4,1,(void *)0x2,
             (socklen_t)option);
  eVar1._4_4_ = 0;
  eVar1._M_value = ec->_M_value;
  eVar1._M_cat = ec->_M_cat;
  return eVar1;
}

Assistant:

asio::error_code set_option(implementation_type& impl,
      const Option& option, asio::error_code& ec)
  {
    socket_ops::setsockopt(impl.socket_, impl.state_,
        option.level(impl.protocol_), option.name(impl.protocol_),
        option.data(impl.protocol_), option.size(impl.protocol_), ec);
    return ec;
  }